

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp.h
# Opt level: O2

double __thiscall atan_fm_demodulator::operator()(atan_fm_demodulator *this,complex<double> *s)

{
  undefined8 uVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  complex<double> local_30;
  complex<double> local_20;
  
  local_30._M_value._8_8_ = *(ulong *)((this->s1)._M_value + 8) ^ 0x8000000000000000;
  local_30._M_value._0_8_ = *(undefined8 *)(this->s1)._M_value;
  uVar3 = local_30._M_value._0_4_;
  uVar4 = local_30._M_value._4_4_;
  std::operator*(&local_30,s);
  local_20._M_value._12_4_ = uVar4;
  local_20._M_value._8_4_ = uVar3;
  dVar2 = std::arg<double>(&local_20);
  uVar1 = *(undefined8 *)(s->_M_value + 8);
  *(undefined8 *)(this->s1)._M_value = *(undefined8 *)s->_M_value;
  *(undefined8 *)((this->s1)._M_value + 8) = uVar1;
  return dVar2;
}

Assistant:

double operator()(const std::complex<double>& s)
    {
        double d = std::arg(std::conj(s1) * s);
        s1 = s;
        return d;
    }